

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_bool32 drwav_seek_to_pcm_frame(drwav *pWav,drwav_uint64 targetFrameIndex)

{
  drwav_bool32 dVar1;
  drwav_uint32 dVar2;
  drwav_uint64 dVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  drwav_int16 devnull [2048];
  
  if (pWav == (drwav *)0x0) {
    return 0;
  }
  if (pWav->onSeek == (drwav_seek_proc)0x0) {
    return 0;
  }
  if (pWav->onWrite != (drwav_write_proc)0x0) {
    return 0;
  }
  uVar6 = pWav->totalPCMFrameCount;
  if (uVar6 != 0) {
    uVar5 = uVar6 - 1;
    if (targetFrameIndex < uVar6) {
      uVar5 = targetFrameIndex;
    }
    if ((pWav->translatedFormatTag != 0x11) && (pWav->translatedFormatTag != 2)) {
      dVar2 = drwav_get_bytes_per_pcm_frame(pWav);
      uVar6 = uVar6 * dVar2;
      uVar4 = uVar6 - pWav->bytesRemaining;
      if (uVar6 < pWav->bytesRemaining) {
        __assert_fail("totalSizeInBytes >= pWav->bytesRemaining",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                      ,0xe9f,"drwav_bool32 drwav_seek_to_pcm_frame(drwav *, drwav_uint64)");
      }
      uVar5 = uVar5 * dVar2;
      uVar6 = uVar5 - uVar4;
      if ((uVar5 < uVar4 || uVar6 == 0) &&
         (dVar1 = drwav_seek_to_first_pcm_frame(pWav), uVar6 = uVar5, dVar1 == 0)) {
        return 0;
      }
      while( true ) {
        if (uVar6 == 0) {
          return 1;
        }
        uVar5 = 0x7fffffff;
        if (uVar6 < 0x7fffffff) {
          uVar5 = uVar6;
        }
        dVar1 = (*pWav->onSeek)(pWav->pUserData,(int)uVar5,drwav_seek_origin_current);
        if (dVar1 == 0) break;
        pWav->bytesRemaining = pWav->bytesRemaining - uVar5;
        uVar6 = uVar6 - uVar5;
      }
      return 0;
    }
    uVar6 = (pWav->compressed).iCurrentPCMFrame;
    if (uVar5 < uVar6) {
      dVar1 = drwav_seek_to_first_pcm_frame(pWav);
      if (dVar1 == 0) {
        return 0;
      }
      uVar6 = (pWav->compressed).iCurrentPCMFrame;
    }
    uVar4 = uVar5 - uVar6;
    if (uVar6 <= uVar5 && uVar4 != 0) {
      while (uVar4 != 0) {
        uVar6 = (ulong)(0x800 / pWav->channels);
        if (uVar4 < uVar6) {
          uVar6 = uVar4;
        }
        if (pWav->translatedFormatTag == 0x11) {
          dVar3 = drwav_read_pcm_frames_s16__ima(pWav,uVar6,devnull);
        }
        else {
          if (pWav->translatedFormatTag != 2) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/dr_wav.h"
                          ,0xe8e,"drwav_bool32 drwav_seek_to_pcm_frame(drwav *, drwav_uint64)");
          }
          dVar3 = drwav_read_pcm_frames_s16__msadpcm(pWav,uVar6,devnull);
        }
        uVar4 = uVar4 - dVar3;
        if (dVar3 != uVar6) {
          return 0;
        }
      }
    }
  }
  return 1;
}

Assistant:

DRWAV_API drwav_bool32 drwav_seek_to_pcm_frame(drwav* pWav, drwav_uint64 targetFrameIndex)
{
    /* Seeking should be compatible with wave files > 2GB. */

    if (pWav == NULL || pWav->onSeek == NULL) {
        return DRWAV_FALSE;
    }

    /* No seeking in write mode. */
    if (pWav->onWrite != NULL) {
        return DRWAV_FALSE;
    }

    /* If there are no samples, just return DRWAV_TRUE without doing anything. */
    if (pWav->totalPCMFrameCount == 0) {
        return DRWAV_TRUE;
    }

    /* Make sure the sample is clamped. */
    if (targetFrameIndex >= pWav->totalPCMFrameCount) {
        targetFrameIndex  = pWav->totalPCMFrameCount - 1;
    }

    /*
    For compressed formats we just use a slow generic seek. If we are seeking forward we just seek forward. If we are going backwards we need
    to seek back to the start.
    */
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        /* TODO: This can be optimized. */
        
        /*
        If we're seeking forward it's simple - just keep reading samples until we hit the sample we're requesting. If we're seeking backwards,
        we first need to seek back to the start and then just do the same thing as a forward seek.
        */
        if (targetFrameIndex < pWav->compressed.iCurrentPCMFrame) {
            if (!drwav_seek_to_first_pcm_frame(pWav)) {
                return DRWAV_FALSE;
            }
        }

        if (targetFrameIndex > pWav->compressed.iCurrentPCMFrame) {
            drwav_uint64 offsetInFrames = targetFrameIndex - pWav->compressed.iCurrentPCMFrame;

            drwav_int16 devnull[2048];
            while (offsetInFrames > 0) {
                drwav_uint64 framesRead = 0;
                drwav_uint64 framesToRead = offsetInFrames;
                if (framesToRead > drwav_countof(devnull)/pWav->channels) {
                    framesToRead = drwav_countof(devnull)/pWav->channels;
                }

                if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
                    framesRead = drwav_read_pcm_frames_s16__msadpcm(pWav, framesToRead, devnull);
                } else if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
                    framesRead = drwav_read_pcm_frames_s16__ima(pWav, framesToRead, devnull);
                } else {
                    DRWAV_ASSERT(DRWAV_FALSE);  /* If this assertion is triggered it means I've implemented a new compressed format but forgot to add a branch for it here. */
                }

                if (framesRead != framesToRead) {
                    return DRWAV_FALSE;
                }

                offsetInFrames -= framesRead;
            }
        }
    } else {
        drwav_uint64 totalSizeInBytes;
        drwav_uint64 currentBytePos;
        drwav_uint64 targetBytePos;
        drwav_uint64 offset;

        totalSizeInBytes = pWav->totalPCMFrameCount * drwav_get_bytes_per_pcm_frame(pWav);
        DRWAV_ASSERT(totalSizeInBytes >= pWav->bytesRemaining);

        currentBytePos = totalSizeInBytes - pWav->bytesRemaining;
        targetBytePos  = targetFrameIndex * drwav_get_bytes_per_pcm_frame(pWav);

        if (currentBytePos < targetBytePos) {
            /* Offset forwards. */
            offset = (targetBytePos - currentBytePos);
        } else {
            /* Offset backwards. */
            if (!drwav_seek_to_first_pcm_frame(pWav)) {
                return DRWAV_FALSE;
            }
            offset = targetBytePos;
        }

        while (offset > 0) {
            int offset32 = ((offset > INT_MAX) ? INT_MAX : (int)offset);
            if (!pWav->onSeek(pWav->pUserData, offset32, drwav_seek_origin_current)) {
                return DRWAV_FALSE;
            }

            pWav->bytesRemaining -= offset32;
            offset -= offset32;
        }
    }

    return DRWAV_TRUE;
}